

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_ref.cpp
# Opt level: O0

MPP_RET mpp_enc_ref_cfg_reset(MppEncRefCfg ref)

{
  MPP_RET MVar1;
  MppEncRefCfgImpl *p;
  MppEncRefCfg ref_local;
  
  MVar1 = _check_is_mpp_enc_ref_cfg("mpp_enc_ref_cfg_reset",ref);
  if (MVar1 == MPP_OK) {
    if (*(long *)((long)ref + 0x28) != 0) {
      mpp_osal_free("mpp_enc_ref_cfg_reset",*(void **)((long)ref + 0x28));
    }
    *(undefined8 *)((long)ref + 0x28) = 0;
    if (*(long *)((long)ref + 0x30) != 0) {
      mpp_osal_free("mpp_enc_ref_cfg_reset",*(void **)((long)ref + 0x30));
    }
    *(undefined8 *)((long)ref + 0x30) = 0;
    memset(ref,0,0x58);
    *(char **)ref = module_name;
    ref_local._4_4_ = MPP_OK;
  }
  else {
    ref_local._4_4_ = MPP_ERR_VALUE;
  }
  return ref_local._4_4_;
}

Assistant:

MPP_RET mpp_enc_ref_cfg_reset(MppEncRefCfg ref)
{
    if (check_is_mpp_enc_ref_cfg(ref))
        return MPP_ERR_VALUE;

    MppEncRefCfgImpl *p = (MppEncRefCfgImpl *)ref;
    MPP_FREE(p->lt_cfg);
    MPP_FREE(p->st_cfg);
    memset(p, 0, sizeof(*p));
    setup_mpp_enc_ref_cfg(p);

    return MPP_OK;
}